

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

string * duckdb::StringUtil::URLDecode
                   (string *__return_storage_ptr__,string *input,bool plus_to_space)

{
  RESULT_TYPE __n;
  char *output;
  idx_t result_length;
  RESULT_TYPE local_30;
  
  local_30 = 0;
  URLDecodeInternal<duckdb::URLEncodeLength>
            ((input->_M_dataplus)._M_p,input->_M_string_length,&local_30,plus_to_space);
  __n = local_30;
  output = (char *)operator_new__(local_30);
  switchD_01043a80::default(output,0,__n);
  URLDecodeBuffer((input->_M_dataplus)._M_p,input->_M_string_length,output,plus_to_space);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,output,output + __n);
  operator_delete__(output);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::URLDecode(const string &input, bool plus_to_space) {
	idx_t result_size = URLDecodeSize(input.c_str(), input.size(), plus_to_space);
	auto result_data = make_uniq_array<char>(result_size);
	URLDecodeBuffer(input.c_str(), input.size(), result_data.get(), plus_to_space);
	return string(result_data.get(), result_size);
}